

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O3

void Serialize<DataStream,std::__cxx11::string,std::pair<uint256,CPubKey>>
               (DataStream *os,
               pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<uint256,_CPubKey>_>
               *item)

{
  long lVar1;
  CPubKey *this;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<DataStream,char>(os,&item->first);
  this = &(item->second).second;
  std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
            ((vector<std::byte,zero_after_free_allocator<std::byte>> *)os,
             (os->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
             super__Vector_impl_data._M_finish,&item->second,this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    CPubKey::Serialize<DataStream>(this,os);
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Serialize(Stream& os, const std::pair<K, T>& item)
{
    Serialize(os, item.first);
    Serialize(os, item.second);
}